

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_uint tdefl_create_comp_flags_from_zip_params(int level,int window_bits,int strategy)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = 10;
  if ((uint)level < 10) {
    uVar1 = level;
  }
  uVar2 = 6;
  if (-1 < level) {
    uVar2 = (ulong)uVar1;
  }
  uVar3 = (uint)(level < 4) << 0xe |
          tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar2];
  uVar1 = uVar3 | 0x1000;
  if (window_bits < 1) {
    uVar1 = uVar3;
  }
  if (level == 0) {
    return uVar1 | 0x80000;
  }
  switch(strategy) {
  case 1:
    return uVar1 | 0x20000;
  case 2:
    return uVar1 & 0xfffff000;
  case 3:
    uVar1 = uVar1 | 0x10000;
    break;
  case 4:
    return uVar1 | 0x40000;
  }
  return uVar1;
}

Assistant:

mz_uint tdefl_create_comp_flags_from_zip_params(int level, int window_bits, int strategy)
{
  mz_uint comp_flags = s_tdefl_num_probes[(level >= 0) ? MZ_MIN(10, level) : MZ_DEFAULT_LEVEL] | ((level <= 3) ? TDEFL_GREEDY_PARSING_FLAG : 0);
  if (window_bits > 0) comp_flags |= TDEFL_WRITE_ZLIB_HEADER;

  if (!level) comp_flags |= TDEFL_FORCE_ALL_RAW_BLOCKS;
  else if (strategy == MZ_FILTERED) comp_flags |= TDEFL_FILTER_MATCHES;
  else if (strategy == MZ_HUFFMAN_ONLY) comp_flags &= ~TDEFL_MAX_PROBES_MASK;
  else if (strategy == MZ_FIXED) comp_flags |= TDEFL_FORCE_ALL_STATIC_BLOCKS;
  else if (strategy == MZ_RLE) comp_flags |= TDEFL_RLE_MATCHES;

  return comp_flags;
}